

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O3

bool __thiscall duckdb_re2::BitState::TrySearch(BitState *this,int id0,char *p0)

{
  ushort uVar1;
  const_pointer pcVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  Job *pJVar5;
  StringPiece *pSVar6;
  char **ppcVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  int iVar11;
  uint32_t uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  byte *pbVar19;
  Inst *pIVar20;
  long lVar21;
  byte *p;
  byte *pbVar22;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar2 = (this->text_).data_;
  sVar3 = (this->text_).size_;
  this->njob_ = 0;
  iVar14 = ((int)sVar3 + 1) *
           (uint)((_Head_base<0UL,_unsigned_short_*,_false> *)
                 ((long)&(this->prog_->list_heads_).ptr_._M_t.
                         super___uniq_ptr_impl<unsigned_short,_duckdb_re2::PODArray<unsigned_short>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_short_*,_duckdb_re2::PODArray<unsigned_short>::Deleter>
                 + 8))->_M_head_impl[id0];
  iVar11 = (int)p0 - (int)pcVar2;
  uVar15 = iVar14 + iVar11;
  uVar18 = iVar14 + iVar11 + 0x3f;
  if (-1 < (int)uVar15) {
    uVar18 = uVar15;
  }
  puVar4 = (this->visited_).ptr_._M_t.
           super___uniq_ptr_impl<unsigned_long,_duckdb_re2::PODArray<unsigned_long>::Deleter>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_duckdb_re2::PODArray<unsigned_long>::Deleter>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  uVar13 = puVar4[(int)uVar18 >> 6];
  if ((uVar13 >> ((ulong)uVar15 & 0x3f) & 1) == 0) {
    puVar4[(int)uVar18 >> 6] = 1L << ((byte)uVar15 & 0x3f) | uVar13;
    Push(this,id0,p0);
    iVar11 = this->njob_;
    if (0 < iVar11) {
      pbVar19 = (byte *)(pcVar2 + sVar3);
      bVar10 = false;
      while( true ) {
        uVar15 = iVar11 - 1;
        this->njob_ = uVar15;
        pJVar5 = (this->job_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Job_*,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Job_*,_false>._M_head_impl;
        uVar18 = pJVar5[uVar15].id;
        uVar13 = (ulong)uVar18;
        pbVar22 = (byte *)pJVar5[uVar15].p;
        if (-1 < (int)uVar18) break;
        (this->cap_).ptr_._M_t.
        super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>._M_t.
        super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>.
        super__Head_base<0UL,_const_char_**,_false>._M_head_impl
        [((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
         ((long)&(this->prog_->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
         + 8))->_M_head_impl[-uVar18].field_1.cap_] = (char *)pbVar22;
switchD_0048267e_caseD_7:
        iVar11 = this->njob_;
        if (iVar11 < 1) {
          return bVar10;
        }
      }
      iVar11 = pJVar5[uVar15].rle;
      if (0 < (long)iVar11) {
        pJVar5[uVar15].rle = iVar11 + -1;
        this->njob_ = this->njob_ + 1;
        pbVar22 = pbVar22 + iVar11;
      }
LAB_0048265d:
      lVar21 = (long)(int)uVar13;
      pIVar20 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                ((long)&(this->prog_->inst_).ptr_._M_t.
                        super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                + 8))->_M_head_impl;
      uVar18 = pIVar20[lVar21].out_opcode_;
      p = pbVar22;
      switch(uVar18 & 7) {
      case 0:
switchD_0048267e_caseD_0:
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Unexpected opcode: ",0x13);
        std::ostream::operator<<(local_1a8,pIVar20[lVar21].out_opcode_ & 7);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        return false;
      case 1:
switchD_0048267e_caseD_1:
        do {
          uVar13 = (ulong)(uVar18 >> 4);
          uVar15 = pIVar20[uVar13].out_opcode_ & 7;
          if (uVar15 == 6) {
            uVar15 = pIVar20[pIVar20[uVar13].out_opcode_ >> 4].out_opcode_ & 7;
          }
          pbVar22 = pbVar19;
          if (uVar15 != 2) goto LAB_004826ce;
          lVar21 = (long)pIVar20[lVar21].field_1.cap_;
          pIVar20 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                    ((long)&(this->prog_->inst_).ptr_._M_t.
                            super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                    + 8))->_M_head_impl;
          uVar18 = pIVar20[lVar21].out_opcode_;
          p = pbVar19;
          switch(uVar18 & 7) {
          case 0:
            goto switchD_0048267e_caseD_0;
          case 2:
switchD_0048267e_caseD_2:
            uVar15 = 0xffffffff;
            if (p < pbVar19) {
              uVar15 = (uint)*p;
            }
            uVar1 = pIVar20[lVar21].field_1.byte_range.hint_foldcase_;
            uVar16 = uVar15 | 0x20;
            if ((uVar1 & 1) == 0) {
              uVar16 = uVar15;
            }
            if (0x19 < uVar15 - 0x41) {
              uVar16 = uVar15;
            }
            if ((int)uVar16 < (int)(uint)pIVar20[lVar21].field_1.byte_range.lo_) goto LAB_004827df;
            if ((int)(uint)pIVar20[lVar21].field_1.byte_range.hi_ < (int)uVar16) goto LAB_004827df;
            if (1 < uVar1) {
              Push(this,(uint)(uVar1 >> 1) + (int)lVar21,(char *)p);
            }
            pbVar22 = p + 1;
            do {
              uVar15 = pIVar20[lVar21].out_opcode_ >> 4;
              iVar11 = ((int)(this->text_).size_ + 1) *
                       (uint)((_Head_base<0UL,_unsigned_short_*,_false> *)
                             ((long)&(this->prog_->list_heads_).ptr_._M_t.
                                     super___uniq_ptr_impl<unsigned_short,_duckdb_re2::PODArray<unsigned_short>::Deleter>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_short_*,_duckdb_re2::PODArray<unsigned_short>::Deleter>
                             + 8))->_M_head_impl[uVar15];
              iVar14 = (int)pbVar22 - *(int *)&(this->text_).data_;
              uVar16 = iVar11 + iVar14;
              uVar18 = iVar11 + iVar14 + 0x3f;
              if (-1 < (int)uVar16) {
                uVar18 = uVar16;
              }
              puVar4 = (this->visited_).ptr_._M_t.
                       super___uniq_ptr_impl<unsigned_long,_duckdb_re2::PODArray<unsigned_long>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_duckdb_re2::PODArray<unsigned_long>::Deleter>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              uVar13 = puVar4[(int)uVar18 >> 6];
              if ((uVar13 >> ((ulong)uVar16 & 0x3f) & 1) != 0) goto switchD_0048267e_caseD_7;
              puVar4[(int)uVar18 >> 6] = 1L << ((byte)uVar16 & 0x3f) | uVar13;
              lVar21 = (long)(int)uVar15;
              pIVar20 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                        ((long)&(this->prog_->inst_).ptr_._M_t.
                                super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                        + 8))->_M_head_impl;
              uVar18 = pIVar20[lVar21].out_opcode_;
              p = pbVar22;
              switch(uVar18 & 7) {
              case 0:
                goto switchD_0048267e_caseD_0;
              case 1:
                goto switchD_0048267e_caseD_1;
              case 2:
                goto switchD_0048267e_caseD_2;
              case 3:
switchD_0048267e_caseD_3:
                if ((uVar18 & 8) == 0) {
                  Push(this,(int)lVar21 + 1,(char *)pbVar22);
                }
                iVar11 = pIVar20[lVar21].field_1.cap_;
                if ((-1 < (long)iVar11) &&
                   (iVar11 < (int)(this->cap_).ptr_._M_t.
                                  super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>
                                  .
                                  super__Tuple_impl<1UL,_duckdb_re2::PODArray<const_char_*>::Deleter>
                                  .
                                  super__Head_base<1UL,_duckdb_re2::PODArray<const_char_*>::Deleter,_false>
                   )) {
                  Push(this,-(int)lVar21,
                       (this->cap_).ptr_._M_t.
                       super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>
                       .super__Head_base<0UL,_const_char_**,_false>._M_head_impl[iVar11]);
                  (this->cap_).ptr_._M_t.
                  super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>
                  .super__Head_base<0UL,_const_char_**,_false>._M_head_impl
                  [pIVar20[lVar21].field_1.cap_] = (char *)pbVar22;
                }
                break;
              case 4:
switchD_0048267e_caseD_4:
                while( true ) {
                  uVar15 = pIVar20[lVar21].field_1.out1_;
                  uVar12 = Prog::EmptyFlags(&this->context_,(char *)p);
                  uVar18 = pIVar20[lVar21].out_opcode_;
                  pbVar22 = p;
                  if ((uVar15 & ~uVar12) == 0) break;
LAB_004827df:
                  if ((uVar18 & 8) != 0) goto switchD_0048267e_caseD_7;
                  lVar21 = lVar21 + 1;
                  pIVar20 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                            ((long)&(this->prog_->inst_).ptr_._M_t.
                                    super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                            + 8))->_M_head_impl;
                  uVar18 = pIVar20[lVar21].out_opcode_;
                  pbVar22 = p;
                  switch(uVar18 & 7) {
                  case 0:
                    goto switchD_0048267e_caseD_0;
                  case 1:
                    goto switchD_0048267e_caseD_1;
                  case 2:
                    goto switchD_0048267e_caseD_2;
                  case 3:
                    goto switchD_0048267e_caseD_3;
                  case 5:
switchD_0048267e_caseD_5:
                    if ((this->endmatch_ != true) || (p == pbVar19)) {
                      uVar15 = this->nsubmatch_;
                      uVar13 = (ulong)uVar15;
                      if (uVar13 == 0) {
                        return true;
                      }
                      (this->cap_).ptr_._M_t.
                      super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>
                      .super__Head_base<0UL,_const_char_**,_false>._M_head_impl[1] = (char *)p;
                      pcVar2 = this->submatch_->data_;
                      if (pcVar2 == (const_pointer)0x0) {
                        if (0 < (int)uVar15) goto LAB_00482854;
                      }
                      else if ((this->longest_ == true) &&
                              (pcVar2 + this->submatch_->size_ < p && 0 < (int)uVar15)) {
LAB_00482854:
                        lVar17 = 8;
                        do {
                          pSVar6 = this->submatch_;
                          ppcVar7 = (this->cap_).ptr_._M_t.
                                    super___uniq_ptr_impl<const_char_*,_duckdb_re2::PODArray<const_char_*>::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_const_char_**,_duckdb_re2::PODArray<const_char_*>::Deleter>
                                    .super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
                          lVar8 = *(long *)((long)ppcVar7 + lVar17 + -8);
                          lVar9 = *(long *)((long)ppcVar7 + lVar17);
                          *(long *)((long)pSVar6 + lVar17 + -8) = lVar8;
                          *(long *)((long)&pSVar6->data_ + lVar17) = lVar9 - lVar8;
                          lVar17 = lVar17 + 0x10;
                          uVar13 = uVar13 - 1;
                        } while (uVar13 != 0);
                      }
                      bVar10 = true;
                      if (this->longest_ != true) {
                        return true;
                      }
                      if (p == pbVar19) {
                        return true;
                      }
                    }
                    goto LAB_004827df;
                  case 6:
                    goto switchD_0048267e_caseD_6;
                  case 7:
                    goto switchD_0048267e_caseD_7;
                  }
                }
              case 6:
switchD_0048267e_caseD_6:
                if ((uVar18 & 8) == 0) {
                  Push(this,(int)lVar21 + 1,(char *)pbVar22);
                }
                break;
              case 5:
                goto switchD_0048267e_caseD_5;
              case 7:
                goto switchD_0048267e_caseD_7;
              }
            } while( true );
          case 3:
            goto switchD_0048267e_caseD_3;
          case 4:
            goto switchD_0048267e_caseD_4;
          case 5:
            goto switchD_0048267e_caseD_5;
          case 6:
            goto switchD_0048267e_caseD_6;
          case 7:
            goto switchD_0048267e_caseD_7;
          }
        } while( true );
      case 2:
        goto switchD_0048267e_caseD_2;
      case 3:
        goto switchD_0048267e_caseD_3;
      case 4:
        goto switchD_0048267e_caseD_4;
      case 5:
        goto switchD_0048267e_caseD_5;
      case 6:
        goto switchD_0048267e_caseD_6;
      }
      goto switchD_0048267e_caseD_7;
    }
  }
  return false;
LAB_004826ce:
  if (this->longest_ == false) goto LAB_004827df;
  goto LAB_0048265d;
}

Assistant:

bool BitState::TrySearch(int id0, const char* p0) {
  bool matched = false;
  const char* end = text_.data() + text_.size();
  njob_ = 0;
  // Push() no longer checks ShouldVisit(),
  // so we must perform the check ourselves.
  if (ShouldVisit(id0, p0))
    Push(id0, p0);
  while (njob_ > 0) {
    // Pop job off stack.
    --njob_;
    int id = job_[njob_].id;
    int& rle = job_[njob_].rle;
    const char* p = job_[njob_].p;

    if (id < 0) {
      // Undo the Capture.
      cap_[prog_->inst(-id)->cap()] = p;
      continue;
    }

    if (rle > 0) {
      p += rle;
      // Revivify job on stack.
      --rle;
      ++njob_;
    }

  Loop:
    // Visit id, p.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "Unexpected opcode: " << ip->opcode();
        return false;

      case kInstFail:
        break;

      case kInstAltMatch:
        if (ip->greedy(prog_)) {
          // out1 is the Match instruction.
          id = ip->out1();
          p = end;
          goto Loop;
        }
        if (longest_) {
          // ip must be non-greedy...
          // out is the Match instruction.
          id = ip->out();
          p = end;
          goto Loop;
        }
        goto Next;

      case kInstByteRange: {
        int c = -1;
        if (p < end)
          c = *p & 0xFF;
        if (!ip->Matches(c))
          goto Next;

        if (ip->hint() != 0)
          Push(id+ip->hint(), p);  // try the next when we're done
        id = ip->out();
        p++;
        goto CheckAndLoop;
      }

      case kInstCapture:
        if (!ip->last())
          Push(id+1, p);  // try the next when we're done

        if (0 <= ip->cap() && ip->cap() < cap_.size()) {
          // Capture p to register, but save old value first.
          Push(-id, cap_[ip->cap()]);  // undo when we're done
          cap_[ip->cap()] = p;
        }

        id = ip->out();
        goto CheckAndLoop;

      case kInstEmptyWidth:
        if (ip->empty() & ~Prog::EmptyFlags(context_, p))
          goto Next;

        if (!ip->last())
          Push(id+1, p);  // try the next when we're done
        id = ip->out();
        goto CheckAndLoop;

      case kInstNop:
        if (!ip->last())
          Push(id+1, p);  // try the next when we're done
        id = ip->out();

      CheckAndLoop:
        // Sanity check: id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        DCHECK(id == 0 || prog_->inst(id-1)->last());
        if (ShouldVisit(id, p))
          goto Loop;
        break;

      case kInstMatch: {
        if (endmatch_ && p != end)
          goto Next;

        // We found a match.  If the caller doesn't care
        // where the match is, no point going further.
        if (nsubmatch_ == 0)
          return true;

        // Record best match so far.
        // Only need to check end point, because this entire
        // call is only considering one start position.
        matched = true;
        cap_[1] = p;
        if (submatch_[0].data() == NULL ||
            (longest_ && p > submatch_[0].data() + submatch_[0].size())) {
          for (int i = 0; i < nsubmatch_; i++)
            submatch_[i] =
                StringPiece(cap_[2 * i],
                            static_cast<size_t>(cap_[2 * i + 1] - cap_[2 * i]));
        }

        // If going for first match, we're done.
        if (!longest_)
          return true;

        // If we used the entire text, no longer match is possible.
        if (p == end)
          return true;

        // Otherwise, continue on in hope of a longer match.
        // Note the absence of the ShouldVisit() check here
        // due to execution remaining in the same list.
      Next:
        if (!ip->last()) {
          id++;
          goto Loop;
        }
        break;
      }
    }
  }
  return matched;
}